

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O3

Array * __thiscall notch::core::ActivationLayer::backprop(ActivationLayer *this,Array *errors)

{
  SharedBuffers::allocate(&(this->super_ABackpropLayer).shared,this->nSize,this->nSize);
  if (((this->super_ABackpropLayer).shared.inputBuffer.
       super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
       (element_type *)0x0) &&
     ((this->super_ABackpropLayer).shared.outputBuffer.
      super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0)) {
    if (this->nSize == errors->_M_size) {
      (*(this->super_ABackpropLayer)._vptr_ABackpropLayer[0x11])(this,errors);
      return &this->propagatedErrors;
    }
    __assert_fail("nSize == errors.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/notch.hpp"
                  ,0x75f,"virtual const Array &notch::ActivationLayer::backprop(const Array &)");
  }
  __assert_fail("shared.ready()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/notch.hpp"
                ,0x75e,"virtual const Array &notch::ActivationLayer::backprop(const Array &)");
}

Assistant:

virtual const Array &backprop(const Array &errors) {
        shared.allocate(nSize, nSize); // just in case user didn't init()
        assert (shared.ready());
        assert (nSize == errors.size());
        backpropInplace(errors);
        return propagatedErrors;
    }